

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.hpp
# Opt level: O0

rb_tree_node<int> * __thiscall
nestl::test::allocator_with_state<nestl::impl::detail::rb_tree_node<int>_>::
allocate<nestl::has_exceptions::exception_ptr_error>
          (allocator_with_state<nestl::impl::detail::rb_tree_node<int>_> *this,
          exception_ptr_error *err,size_t n,void *param_3)

{
  bool bVar1;
  element_type *peVar2;
  base_ptr local_78;
  exception_ptr_error local_70;
  default_operation_error _;
  iterator local_60;
  rb_tree_const_iterator<void_*> local_58;
  base_ptr local_50;
  iterator local_48;
  rb_tree_const_iterator<void_*> local_40;
  const_iterator pos;
  rb_tree_node<int> *res;
  void *param_3_local;
  size_t n_local;
  exception_ptr_error *err_local;
  allocator_with_state<nestl::impl::detail::rb_tree_node<int>_> *this_local;
  
  pos.m_node = (base_ptr)operator_new(n * 0x28,(nothrow_t *)&std::nothrow);
  if (pos.m_node == (base_ptr)0x0) {
    has_exceptions::build_bad_alloc(err);
    this_local = (allocator_with_state<nestl::impl::detail::rb_tree_node<int>_> *)0x0;
  }
  else {
    peVar2 = impl::
             shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>::
             operator->(&this->m_allocated_storage);
    local_50 = pos.m_node;
    local_48.m_node =
         (base_ptr)
         impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>::find(peVar2,&local_50);
    impl::detail::rb_tree_const_iterator<void_*>::rb_tree_const_iterator(&local_40,&local_48);
    peVar2 = impl::
             shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>::
             operator->(&this->m_allocated_storage);
    local_60.m_node =
         (base_ptr)impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>::end(peVar2);
    impl::detail::rb_tree_const_iterator<void_*>::rb_tree_const_iterator(&local_58,&local_60);
    bVar1 = impl::detail::rb_tree_const_iterator<void_*>::operator!=(&local_40,&local_58);
    if (bVar1) {
      _.m_exception._M_exception_object = (exception_ptr)(exception_ptr)pos.m_node;
      fatal_failure<char_const(&)[10],void*,char_const(&)[35]>
                ((char (*) [10])"pointer [",(void **)&_,
                 (char (*) [35])"] already belong to this allocator");
    }
    has_exceptions::exception_ptr_error::exception_ptr_error(&local_70);
    peVar2 = impl::
             shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>::
             operator->(&this->m_allocated_storage);
    local_78 = pos.m_node;
    impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>::
    insert_nothrow<nestl::has_exceptions::exception_ptr_error>(peVar2,&local_70,&local_78);
    check_error(&local_70,"m_allocated_storage->insert_nothrow(_, res)");
    has_exceptions::exception_ptr_error::~exception_ptr_error(&local_70);
    this_local = (allocator_with_state<nestl::impl::detail::rb_tree_node<int>_> *)pos.m_node;
  }
  return (rb_tree_node<int> *)this_local;
}

Assistant:

T* allocate(OperationError& err, std::size_t n, const void* /* hint */ = 0) NESTL_NOEXCEPT_SPEC
    {
        auto res = static_cast<T*>(::operator new(n * sizeof(value_type), std::nothrow));
        if (!res)
        {
            build_bad_alloc(err);
            return nullptr;
        }

        nestl::set<void*>::const_iterator pos = m_allocated_storage->find(res);
        if (pos != m_allocated_storage->end())
        {
            fatal_failure("pointer [", static_cast<void*>(res), "] already belong to this allocator");
        }

        NESTL_CHECK_OPERATION(m_allocated_storage->insert_nothrow(_, res));

        return res;
    }